

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWMeshVertexData.h
# Opt level: O2

void __thiscall COLLADAFW::MeshVertexData::~MeshVertexData(MeshVertexData *this)

{
  InputInfosArray *this_00;
  InputInfos *this_01;
  ulong uVar1;
  
  (this->super_FloatOrDoubleArray).super_Animatable._vptr_Animatable =
       (_func_int **)&PTR__MeshVertexData_00a056d0;
  this_00 = &this->mInputInfosArray;
  for (uVar1 = 0; uVar1 < (this->mInputInfosArray).mCount; uVar1 = uVar1 + 1) {
    this_01 = this_00->mData[uVar1];
    if (this_01 != (InputInfos *)0x0) {
      std::__cxx11::string::~string((string *)this_01);
    }
    operator_delete(this_01,0x30);
  }
  ArrayPrimitiveType<COLLADAFW::MeshVertexData::InputInfos_*>::releaseMemory(this_00);
  ArrayPrimitiveType<COLLADAFW::MeshVertexData::InputInfos_*>::~ArrayPrimitiveType(this_00);
  FloatOrDoubleArray::~FloatOrDoubleArray(&this->super_FloatOrDoubleArray);
  return;
}

Assistant:

virtual ~MeshVertexData()
        {
            for ( size_t i=0; i<mInputInfosArray.getCount(); ++i )
            {
                delete mInputInfosArray [i];
            }
            mInputInfosArray.releaseMemory ();
        }